

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::start_rx_queue(IxgbeDevice *this,uint16_t queue_id)

{
  undefined2 uVar1;
  ixgbe_adv_rx_desc *piVar2;
  uint uVar3;
  reference pvVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  _Optional_payload_base<unsigned_long> _Var9;
  uint16_t queue_id_local;
  optional<unsigned_long> buf;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_40;
  
  buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = anon_var_dwarf_21b9f;
  debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
            ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp",
             0xe8,"start_rx_queue",
             (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_> *)&buf
            );
  pvVar4 = std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::at
                     (&this->rx_queues,(ulong)queue_id);
  uVar1 = pvVar4->num_entries;
  if ((uVar1 & uVar1 - 1) != 0) {
    buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = anon_var_dwarf_21bb8;
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0xec,"start_rx_queue",(LogData<ixy::Pair<ixy::None,_const_char_*>_> *)&buf);
  }
  lVar8 = 8;
  uVar6 = 0;
  while( true ) {
    if (pvVar4->num_entries <= uVar6) {
      uVar7 = (uint)queue_id * 0x40;
      uVar3 = uVar7 + 0xc028;
      if (queue_id < 0x40) {
        uVar3 = uVar7 | 0x1028;
      }
      set_flags32(this,(ulong)uVar3,0x2000000);
      uVar7 = (uint)queue_id * 0x40;
      uVar3 = uVar7 + 0xc028;
      if (queue_id < 0x40) {
        uVar3 = uVar7 | 0x1028;
      }
      wait_set_reg32(this,(ulong)uVar3,0x2000000);
      uVar7 = (uint)queue_id * 0x40;
      uVar3 = uVar7 + 0xc010;
      if (queue_id < 0x40) {
        uVar3 = uVar7 | 0x1010;
      }
      set_reg32(this,(ulong)uVar3,0);
      uVar7 = (uint)queue_id * 0x40;
      uVar3 = uVar7 + 0xc018;
      if (queue_id < 0x40) {
        uVar3 = uVar7 | 0x1018;
      }
      set_reg32(this,(ulong)uVar3,pvVar4->num_entries - 1);
      return;
    }
    _Var9 = (_Optional_payload_base<unsigned_long>)
            Mempool::alloc_buf((pvVar4->mempool).
                               super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload = _Var9._M_payload;
    buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = _Var9._M_engaged;
    if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_40.list.second = "failed to allocate rx descriptor";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                 ,0xf3,"start_rx_queue",&local_40);
      _Var9._8_8_ = buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._8_8_ & 0xff;
      _Var9._M_payload._M_value =
           buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    }
    buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload = _Var9._M_payload;
    if (((undefined1  [16])_Var9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    piVar2 = pvVar4->descriptors;
    uVar5 = Mempool::get_phys_addr
                      ((pvVar4->mempool).
                       super___shared_ptr<ixy::Mempool,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_payload._M_value);
    *(uint64_t *)((long)piVar2 + lVar8 + -8) = uVar5;
    *(undefined8 *)((long)piVar2 + lVar8) = 0;
    if (buf.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == false) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&pvVar4->bufs_in_use,(value_type_conflict1 *)&buf);
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x10;
  }
  std::__throw_bad_optional_access();
}

Assistant:

void IxgbeDevice::start_rx_queue(uint16_t queue_id) {
    debug("starting rx queue " << queue_id);
    auto queue = &rx_queues.at(queue_id);

    if (queue->num_entries & (queue->num_entries - 1)) {
        error("number of queue entries must be a power of 2");
    }

    for (int i = 0; i < queue->num_entries; i++) {
        auto buf = queue->mempool->alloc_buf();

        if (!buf.has_value()) {
            error("failed to allocate rx descriptor");
        }

        volatile union ixgbe_adv_rx_desc *rxd = queue->descriptors + i;
        rxd->read.pkt_addr = queue->mempool->get_phys_addr(buf.value());
        rxd->read.hdr_addr = 0;

        queue->bufs_in_use.push_back(buf.value());
    }

    // enable queue and wait if necessary
    set_flags32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    wait_set_reg32(IXGBE_RXDCTL(queue_id), IXGBE_RXDCTL_ENABLE);
    // rx queue starts out full
    set_reg32(IXGBE_RDH(queue_id), 0);
    // was set to 0 before in the init function
    set_reg32(IXGBE_RDT(queue_id), queue->num_entries - 1);
}